

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

int lj_cdata_get(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  TValue *in_RDX;
  CType *in_RSI;
  CTState *in_RDI;
  CTypeID sid;
  CType *local_80;
  undefined4 in_stack_ffffffffffffff90;
  int iVar1;
  uint in_stack_ffffffffffffff94;
  CTState *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  CType *in_stack_ffffffffffffffa8;
  CTState *in_stack_ffffffffffffffb0;
  
  if (in_RSI->info >> 0x1c == 0xb) {
    cdata_getconst(in_RDI,in_RDX,in_RSI);
    iVar1 = 0;
  }
  else if (in_RSI->info >> 0x1c == 10) {
    iVar1 = lj_cconv_tv_bf(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           (TValue *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (uint8_t *)in_stack_ffffffffffffff98);
  }
  else {
    local_80 = in_RDI->tab + (in_RSI->info & 0xffff);
    if ((local_80->info & 0xf0800000) == 0x20800000) {
      in_stack_ffffffffffffff94 = local_80->info & 0xffff;
      local_80 = in_RDI->tab + in_stack_ffffffffffffff94;
      in_stack_ffffffffffffff98 = in_RDI;
    }
    for (; local_80->info >> 0x1c == 8; local_80 = in_RDI->tab + (local_80->info & 0xffff)) {
    }
    iVar1 = lj_cconv_tv_ct(in_RDI,(CType *)(CONCAT44(in_RSI->info,in_stack_ffffffffffffffa0) &
                                           0xffffffffffff),
                           (CTypeID)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                           (TValue *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (uint8_t *)in_RDI);
  }
  return iVar1;
}

Assistant:

int lj_cdata_get(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTypeID sid;

  if (ctype_isconstval(s->info)) {
    cdata_getconst(cts, o, s);
    return 0;  /* No GC step needed. */
  } else if (ctype_isbitfield(s->info)) {
    return lj_cconv_tv_bf(cts, s, o, sp);
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(s->info) || ctype_isfield(s->info),
	       "pointer or field expected");
  sid = ctype_cid(s->info);
  s = ctype_get(cts, sid);

  /* Resolve reference for field. */
  if (ctype_isref(s->info)) {
    lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
    sp = *(uint8_t **)sp;
    sid = ctype_cid(s->info);
    s = ctype_get(cts, sid);
  }

  /* Skip attributes. */
  while (ctype_isattrib(s->info))
    s = ctype_child(cts, s);

  return lj_cconv_tv_ct(cts, s, sid, o, sp);
}